

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O0

void __thiscall IfStatement::print(IfStatement *this)

{
  int local_20;
  int local_1c;
  int i_1;
  int i;
  IfStatement *next;
  IfStatement *this_local;
  
  std::operator<<((ostream *)&std::cout,"if ");
  (**this->_cond->_vptr_ExprNode)();
  std::operator<<((ostream *)&std::cout,":");
  Statements::print(this->_stmts);
  for (_i_1 = this->_elif; _i_1 != (IfStatement *)0x0; _i_1 = _i_1->_elif) {
    if (_i_1->_cond == (ExprNode *)0x0) {
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      for (local_1c = 0; local_1c < (this->super_Statement).indentState; local_1c = local_1c + 1) {
        std::operator<<((ostream *)&std::cout," ");
      }
      std::operator<<((ostream *)&std::cout,"else");
    }
    else {
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      for (local_20 = 0; local_20 < (this->super_Statement).indentState; local_20 = local_20 + 1) {
        std::operator<<((ostream *)&std::cout," ");
      }
      std::operator<<((ostream *)&std::cout,"elif ");
      (**_i_1->_cond->_vptr_ExprNode)();
    }
    std::operator<<((ostream *)&std::cout,":");
    Statements::print(_i_1->_stmts);
  }
  return;
}

Assistant:

void IfStatement::print() {
    //std::cout << "Printing If Statement...\n";
    std::cout << "if "; _cond->print(); std::cout << ":";
    _stmts->print();
    IfStatement* next = _elif;
    while(next != nullptr) {
        if (next->_cond == nullptr){
            std::cout << std::endl;
            for (int i = 0; i < indentState; i++)
                std::cout << " ";
            std::cout << "else";
        } else {
            std::cout << std::endl;
            for (int i = 0; i < indentState; i++)
                std::cout << " ";
            std::cout << "elif "; next->_cond->print();
        }
        std::cout << ":";
        next->_stmts->print();
        next = next->_elif;
    }
//    std::vector<std::pair<ExprNode*,Statements*>>testsAndSuites = getTestsAndSuites();
//    for(int i = 0; i < testsAndSuites.size();i++){
//        if(i == 0) {
//            std::cout << "if ";
//            testsAndSuites[i].first->print();
//            std::cout <<" : \n";
//            std::cout << "     ";
//            testsAndSuites[i].second->print();
//        }
//        else if( testsAndSuites[i].first == nullptr) {
//            std::cout << "else ";
//            std::cout << " : \n";
//            std::cout << "     ";
//            testsAndSuites[i].second->print();
//        }
//        else{
//            std::cout << "elif ";
//            testsAndSuites[i].first->print();
//            std::cout <<" : \n";
//            std::cout << "     ";
//            testsAndSuites[i].second->print();
//        }
//    }
}